

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  TestCaseInfo *pTVar1;
  IEventListener *pIVar2;
  bool _missingAssertions;
  double _durationInSeconds;
  Timer timer;
  SectionInfo testCaseSection;
  SectionStats testCaseSectionStats;
  Counts diff;
  Timer local_150;
  SectionInfo local_148;
  uint64_t local_118;
  uint64_t uStack_110;
  uint64_t local_108;
  uint64_t uStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  char local_e8 [8];
  undefined8 uStack_e0;
  RedirectedStreams local_d8;
  Counts local_58;
  
  pTVar1 = this->m_activeTestCase->m_info;
  std::__cxx11::string::string((string *)&local_f8,(string *)pTVar1);
  local_148.name._M_string_length = local_f0;
  local_148.name._M_dataplus._M_p = (pointer)&local_148.name.field_2;
  if (local_f8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8) {
    local_148.name.field_2._8_8_ = uStack_e0;
  }
  else {
    local_148.name._M_dataplus._M_p = (pointer)local_f8;
  }
  local_f0 = 0;
  local_e8[0] = '\0';
  local_148.lineInfo.file = (pTVar1->lineInfo).file;
  local_148.lineInfo.line = (pTVar1->lineInfo).line;
  local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_e8;
  std::__cxx11::string::~string((string *)&local_f8);
  pIVar2 = (this->m_reporter).m_ptr;
  (*pIVar2->_vptr_IEventListener[7])(pIVar2,&local_148);
  local_118 = (this->m_totals).assertions.passed;
  uStack_110 = (this->m_totals).assertions.failed;
  local_108 = (this->m_totals).assertions.failedButOk;
  uStack_100 = (this->m_totals).assertions.skipped;
  this->m_shouldReportUnexpected = true;
  local_d8.m_redirectedCout = (string *)(pTVar1->lineInfo).file;
  local_d8.m_redirectedCerr = (string *)(pTVar1->lineInfo).line;
  (this->m_lastAssertionInfo).macroName.m_start = "TEST_CASE";
  (this->m_lastAssertionInfo).macroName.m_size = 9;
  (this->m_lastAssertionInfo).lineInfo.file = (char *)local_d8.m_redirectedCout;
  (this->m_lastAssertionInfo).lineInfo.line = (size_t)local_d8.m_redirectedCerr;
  (this->m_lastAssertionInfo).capturedExpression.m_start = "";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  local_150.m_nanoseconds = 0;
  if ((((this->m_reporter).m_ptr)->m_preferences).shouldRedirectStdOut == true) {
    RedirectedStreams::RedirectedStreams(&local_d8,redirectedCout,redirectedCerr);
    local_150.m_nanoseconds = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
    RedirectedStreams::~RedirectedStreams(&local_d8);
  }
  else {
    local_150.m_nanoseconds = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
  }
  _durationInSeconds = Timer::getElapsedSeconds(&local_150);
  local_58.passed = (this->m_totals).assertions.passed - local_118;
  local_58.failed = (this->m_totals).assertions.failed - uStack_110;
  local_58.failedButOk = (this->m_totals).assertions.failedButOk - local_108;
  local_58.skipped = (this->m_totals).assertions.skipped - uStack_100;
  _missingAssertions = testForMissingAssertions(this,&local_58);
  (*this->m_testCaseTracker->_vptr_ITracker[3])();
  handleUnfinishedSections(this);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
            (&this->m_messageScopes);
  SectionStats::SectionStats
            ((SectionStats *)&local_d8,&local_148,&local_58,_durationInSeconds,_missingAssertions);
  pIVar2 = (this->m_reporter).m_ptr;
  (*pIVar2->_vptr_IEventListener[0xe])(pIVar2,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_148);
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }